

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

void gauden_norm_wt_var(vector_t ***in_var,vector_t ***wt_var,int32 pass2var,float32 ***dnom,
                       vector_t ***mean,uint32 n_mgau,uint32 n_feat,uint32 n_density,uint32 *veclen,
                       int32 tiedvar)

{
  uint uVar1;
  float *pfVar2;
  vector_t pfVar3;
  vector_t pfVar4;
  float32 *pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector_t pfVar11;
  float fVar12;
  
  uVar6 = (ulong)n_mgau;
  if (tiedvar != 0) {
    if (n_feat != 0) {
      uVar7 = 0;
      do {
        if ((pass2var == 0) && (uVar1 = veclen[uVar7], (ulong)uVar1 != 0)) {
          pfVar2 = (float *)(*dnom)[uVar7];
          pfVar3 = *(*mean)[uVar7];
          uVar9 = 0;
          do {
            pfVar3[uVar9] = *pfVar2 * pfVar3[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        if (1 < n_density) {
          uVar1 = veclen[uVar7];
          pfVar2 = (float *)(*dnom)[uVar7];
          uVar9 = 1;
          do {
            if ((ulong)uVar1 != 0) {
              pfVar3 = (*wt_var)[uVar7][uVar9];
              pfVar4 = *(*wt_var)[uVar7];
              uVar10 = 0;
              do {
                pfVar4[uVar10] = pfVar3[uVar10] + pfVar4[uVar10];
                if (pass2var == 0) {
                  pfVar11 = *(*mean)[uVar7];
                  pfVar11[uVar10] = (*mean)[uVar7][uVar9][uVar10] * pfVar2[uVar9] + pfVar11[uVar10];
                }
                uVar10 = uVar10 + 1;
              } while (uVar1 != uVar10);
            }
            *pfVar2 = pfVar2[uVar9] + *pfVar2;
            uVar9 = uVar9 + 1;
          } while (uVar9 != n_density);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != n_feat);
    }
    if (1 < n_mgau) {
      uVar7 = 1;
      do {
        if (n_feat != 0) {
          uVar9 = 0;
          do {
            if (n_density != 0) {
              uVar1 = veclen[uVar9];
              pfVar5 = dnom[uVar7][uVar9];
              pfVar2 = (float *)(*dnom)[uVar9];
              uVar10 = 0;
              do {
                if ((ulong)uVar1 != 0) {
                  pfVar3 = wt_var[uVar7][uVar9][uVar10];
                  pfVar4 = *(*wt_var)[uVar9];
                  uVar8 = 0;
                  do {
                    pfVar4[uVar8] = pfVar3[uVar8] + pfVar4[uVar8];
                    if (pass2var == 0) {
                      (*(*mean)[uVar9])[uVar8] =
                           mean[uVar7][uVar9][uVar10][uVar8] * (float)pfVar5[uVar10] +
                           (*(*mean)[uVar9])[uVar8];
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar1 != uVar8);
                }
                *pfVar2 = (float)pfVar5[uVar10] + *pfVar2;
                uVar10 = uVar10 + 1;
              } while (uVar10 != n_density);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != n_feat);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar6);
    }
    if (n_mgau == 0) {
      return;
    }
    uVar7 = 0;
    do {
      if (n_feat != 0) {
        uVar9 = 0;
        do {
          if (n_density != 0) {
            uVar1 = veclen[uVar9];
            pfVar2 = (float *)(*dnom)[uVar9];
            pfVar5 = dnom[uVar7][uVar9];
            uVar10 = 0;
            do {
              if ((ulong)uVar1 != 0) {
                pfVar3 = *(*wt_var)[uVar9];
                pfVar4 = wt_var[uVar7][uVar9][uVar10];
                uVar8 = 0;
                do {
                  if (pass2var == 0) {
                    if ((int)uVar10 == 0 && (int)uVar7 == 0) {
                      pfVar11 = *(*mean)[uVar9];
                      fVar12 = pfVar11[uVar8] / *pfVar2;
                    }
                    else {
                      fVar12 = (*(*mean)[uVar9])[uVar8];
                      pfVar11 = mean[uVar7][uVar9][uVar10];
                    }
                    pfVar11[uVar8] = fVar12;
                  }
                  pfVar4[uVar8] = pfVar3[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar1 != uVar8);
              }
              pfVar5[uVar10] = (float32)*pfVar2;
              uVar10 = uVar10 + 1;
            } while (uVar10 != n_density);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != n_feat);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar6);
  }
  if (n_mgau != 0) {
    uVar7 = 0;
    do {
      if (n_feat != 0) {
        uVar9 = 0;
        do {
          if (n_density != 0) {
            uVar10 = 0;
            do {
              if (((float)dnom[uVar7][uVar9][uVar10] != 0.0) ||
                 (NAN((float)dnom[uVar7][uVar9][uVar10]))) {
                if (veclen[uVar9] != 0) {
                  uVar8 = 0;
                  do {
                    if (pass2var == 0) {
                      wt_var[uVar7][uVar9][uVar10][uVar8] =
                           wt_var[uVar7][uVar9][uVar10][uVar8] / (float)dnom[uVar7][uVar9][uVar10] -
                           mean[uVar7][uVar9][uVar10][uVar8] * mean[uVar7][uVar9][uVar10][uVar8];
                    }
                    else {
                      wt_var[uVar7][uVar9][uVar10][uVar8] =
                           wt_var[uVar7][uVar9][uVar10][uVar8] / (float)dnom[uVar7][uVar9][uVar10];
                    }
                    if (wt_var[uVar7][uVar9][uVar10][uVar8] <= 0.0 &&
                        wt_var[uVar7][uVar9][uVar10][uVar8] != 0.0) {
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                              ,0x694,
                              "Variance (mgau= %u, feat= %u, density=%u, component=%u) is less then 0. Most probably the number of senones is too high for such a small training database. Use smaller $CFG_N_TIED_STATES.\n"
                              ,uVar7 & 0xffffffff,uVar9 & 0xffffffff,uVar10,uVar8);
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar8 < veclen[uVar9]);
                }
              }
              else if (in_var != (vector_t ***)0x0) {
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                        ,0x69b,"Copying unseen var (%u, %u, %u) from in_var\n",uVar7 & 0xffffffff,
                        uVar9 & 0xffffffff,uVar10);
                uVar1 = veclen[uVar9];
                if ((ulong)uVar1 != 0) {
                  pfVar3 = in_var[uVar7][uVar9][uVar10];
                  pfVar4 = wt_var[uVar7][uVar9][uVar10];
                  uVar8 = 0;
                  do {
                    pfVar4[uVar8] = pfVar3[uVar8];
                    uVar8 = uVar8 + 1;
                  } while (uVar1 != uVar8);
                }
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != n_density);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != n_feat);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar6);
  }
  return;
}

Assistant:

void
gauden_norm_wt_var(vector_t ***in_var,
		   vector_t ***wt_var,
		   int32 pass2var,
		   float32 ***dnom,
		   vector_t ***mean,
		   uint32 n_mgau,
		   uint32 n_feat,
		   uint32 n_density,
		   const uint32 *veclen,
		   int32 tiedvar)
{
    uint32 i, j, k, l;

    if (tiedvar) {
	gauden_tie_vars_dnoms(wt_var, pass2var, dnom, mean,
			      n_mgau, n_feat, n_density, veclen);
    }
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (dnom[i][j][k] != 0) {
		    for (l = 0; l < veclen[j]; l++) {
			if (!pass2var) {
			    wt_var[i][j][k][l] =
				(wt_var[i][j][k][l] / dnom[i][j][k]) -
				(mean[i][j][k][l] * mean[i][j][k][l]);
			}
			else {
			    wt_var[i][j][k][l] /= dnom[i][j][k];
			}

			if (wt_var[i][j][k][l] < 0) {
			    E_ERROR("Variance (mgau= %u, feat= %u, "
				    "density=%u, component=%u) is less then 0. "
				    "Most probably the number of senones is "
				    "too high for such a small training "
				    "database. Use smaller $CFG_N_TIED_STATES.\n",
				    i, j, k, l);
			}
		    }
		}
		else {
		    if (in_var) {
			E_INFO("Copying unseen var (%u, %u, %u) from in_var\n",
			       i, j, k);
			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}